

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

pair<subprocess::Buffer,_subprocess::Buffer> * __thiscall
subprocess::detail::Communication::communicate(Communication *this,char *msg,size_t length)

{
  initializer_list<_IO_FILE_*> __ils;
  initializer_list<_IO_FILE_*> __ils_00;
  int iVar1;
  int iVar2;
  difference_type dVar3;
  FILE *pFVar4;
  FILE *__s;
  size_t sVar5;
  int *piVar6;
  undefined8 uVar7;
  char *pcVar8;
  string *err_msg;
  size_t in_RCX;
  void *in_RDX;
  pair<subprocess::Buffer,_subprocess::Buffer> *in_RDI;
  long in_FS_OFFSET;
  int rbytes_1;
  int rbytes;
  int wbytes;
  int len_conv;
  int count;
  ErrBuffer ebuf;
  OutBuffer obuf;
  initializer_list<_IO_FILE_*> hndls;
  Streams *in_stack_fffffffffffffdf8;
  Buffer *in_stack_fffffffffffffe00;
  __shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  void **in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  Communication *in_stack_fffffffffffffe78;
  undefined1 local_fa [58];
  long local_c0;
  undefined8 local_b8;
  FILE **local_b0;
  undefined8 local_a8;
  FILE **local_a0;
  undefined8 local_98;
  FILE **local_90;
  undefined8 local_88;
  FILE *local_20;
  FILE *local_18;
  FILE *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = Streams::input(in_stack_fffffffffffffdf8);
  local_18 = Streams::output(in_stack_fffffffffffffdf8);
  local_10 = Streams::error(in_stack_fffffffffffffdf8);
  local_a0 = &local_20;
  local_88 = 3;
  local_98 = 3;
  __ils._M_len = (size_type)in_stack_fffffffffffffe08;
  __ils._M_array = (iterator)in_stack_fffffffffffffe00;
  local_90 = local_a0;
  std::begin<_IO_FILE*>(__ils);
  local_b0 = local_90;
  local_a8 = local_88;
  __ils_00._M_len = (size_type)in_stack_fffffffffffffe08;
  __ils_00._M_array = (iterator)in_stack_fffffffffffffe00;
  std::end<_IO_FILE*>(__ils_00);
  local_b8 = 0;
  dVar3 = std::count<_IO_FILE*const*,decltype(nullptr)>
                    ((_IO_FILE **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (_IO_FILE **)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  if ((int)dVar3 < 2) {
    communicate_threaded
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  else {
    Buffer::Buffer((Buffer *)in_stack_fffffffffffffdf8);
    Buffer::Buffer((Buffer *)in_stack_fffffffffffffdf8);
    pFVar4 = Streams::input(in_stack_fffffffffffffdf8);
    if (pFVar4 == (FILE *)0x0) {
      pFVar4 = Streams::output(in_stack_fffffffffffffdf8);
      if (pFVar4 == (FILE *)0x0) {
        pFVar4 = Streams::error(in_stack_fffffffffffffdf8);
        if (pFVar4 != (FILE *)0x0) {
          Buffer::add_cap((Buffer *)in_stack_fffffffffffffdf8,0x819c55);
          Streams::error(in_stack_fffffffffffffdf8);
          pcVar8 = local_fa + 2;
          err_msg = (string *)
                    std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdf8);
          std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdf8);
          iVar2 = util::read_atmost_n((FILE *)err_msg,pcVar8,in_stack_fffffffffffffe10);
          iVar1 = (int)((ulong)pcVar8 >> 0x20);
          if (iVar2 == -1) {
            uVar7 = __cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(allocator<char> *)pFVar4
                      );
            __errno_location();
            OSError::OSError((OSError *)CONCAT44(iVar2,in_stack_fffffffffffffe28),err_msg,iVar1);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(uVar7,&OSError::typeinfo,OSError::~OSError);
            }
            goto LAB_00819eb9;
          }
          local_fa._26_8_ = SEXT48(iVar2);
          std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffffe08);
        }
      }
      else {
        Buffer::add_cap((Buffer *)in_stack_fffffffffffffdf8,0x819a9e);
        Streams::output(in_stack_fffffffffffffdf8);
        iVar1 = util::read_all((FILE *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        if (iVar1 == -1) {
          pcVar8 = (char *)__cxa_allocate_exception(0x10);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fa;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,pcVar8,in_stack_fffffffffffffe38);
          __errno_location();
          OSError::OSError((OSError *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           in_stack_fffffffffffffe20,iVar2);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(pcVar8,&OSError::typeinfo,OSError::~OSError);
          }
          goto LAB_00819eb9;
        }
        local_c0 = (long)iVar1;
        std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffffe08);
      }
    }
    else {
      if (in_RDX != (void *)0x0) {
        __s = (FILE *)Streams::input(in_stack_fffffffffffffdf8);
        sVar5 = fwrite(in_RDX,1,in_RCX,__s);
        if ((((int)sVar5 < (int)in_RCX) && (piVar6 = __errno_location(), *piVar6 != 0x20)) &&
           (piVar6 = __errno_location(), *piVar6 != 0x16)) {
          uVar7 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          __errno_location();
          OSError::OSError((OSError *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           in_stack_fffffffffffffe20,iVar2);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar7,&OSError::typeinfo,OSError::~OSError);
          }
          goto LAB_00819eb9;
        }
      }
      std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_fffffffffffffe08);
    }
    std::make_pair<subprocess::Buffer,subprocess::Buffer>
              (in_stack_fffffffffffffe00,(Buffer *)in_stack_fffffffffffffdf8);
    Buffer::~Buffer((Buffer *)in_stack_fffffffffffffdf8);
    Buffer::~Buffer((Buffer *)in_stack_fffffffffffffdf8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
LAB_00819eb9:
  __stack_chk_fail();
}

Assistant:

inline std::pair<OutBuffer, ErrBuffer>
  Communication::communicate(const char* msg, size_t length)
  {
    // Optimization from subprocess.py
    // If we are using one pipe, or no pipe
    // at all, using select() or threads is unnecessary.
    auto hndls = {stream_->input(), stream_->output(), stream_->error()};
    int count = std::count(std::begin(hndls), std::end(hndls), nullptr);
    const int len_conv = length;

    if (count >= 2) {
      OutBuffer obuf;
      ErrBuffer ebuf;
      if (stream_->input()) {
        if (msg) {
          int wbytes = std::fwrite(msg, sizeof(char), length, stream_->input());
          if (wbytes < len_conv) {
            if (errno != EPIPE && errno != EINVAL) {
              throw OSError("fwrite error", errno);
            }
          }
        }
        // Close the input stream
        stream_->input_.reset();
      } else if (stream_->output()) {
        // Read till EOF
        // ATTN: This could be blocking, if the process
        // at the other end screws up, we get screwed as well
        obuf.add_cap(out_buf_cap_);

        int rbytes = util::read_all(
                            stream_->output(),
                            obuf.buf);

        if (rbytes == -1) {
          throw OSError("read to obuf failed", errno);
        }

        obuf.length = rbytes;
        // Close the output stream
        stream_->output_.reset();

      } else if (stream_->error()) {
        // Same screwness applies here as well
        ebuf.add_cap(err_buf_cap_);

        int rbytes = util::read_atmost_n(
                                  stream_->error(),
                                  ebuf.buf.data(),
                                  ebuf.buf.size());

        if (rbytes == -1) {
          throw OSError("read to ebuf failed", errno);
        }

        ebuf.length = rbytes;
        // Close the error stream
        stream_->error_.reset();
      }
      return std::make_pair(std::move(obuf), std::move(ebuf));
    }

    return communicate_threaded(msg, length);
  }